

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

int proxy_init(proxy_handle *ph)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = ph->priv;
  if (pvVar2 == (void *)0x0) {
    pvVar2 = calloc(1,0x898);
    if (pvVar2 == (void *)0x0) {
      return -0xc;
    }
    ph->priv = pvVar2;
  }
  iVar1 = rand_init();
  if (((-1 < iVar1) && (iVar1 = log_init((log_handle *)((long)pvVar2 + 0x860)), -1 < iVar1)) &&
     (iVar1 = conf_init(&ph->conf), -1 < iVar1)) {
    *(undefined4 *)((long)pvVar2 + 0x858) = 0;
    iVar1 = conn_init((conn_handle *)((long)pvVar2 + 0x840));
    if (((-1 < iVar1) &&
        (iVar1 = registration_service_init((registration_service_handle *)((long)pvVar2 + 0x888)),
        -1 < iVar1)) &&
       ((iVar1 = mutex_init((mutex_handle *)((long)pvVar2 + 0x870)), -1 < iVar1 &&
        ((iVar1 = mutex_init((mutex_handle *)((long)pvVar2 + 0x878)), -1 < iVar1 &&
         (iVar1 = mutex_init((mutex_handle *)((long)pvVar2 + 0x880)), -1 < iVar1)))))) {
      return 0;
    }
  }
  proxy_free(ph);
  return iVar1;
}

Assistant:

int proxy_init(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		ph->priv = priv;
	}

	/* Initialize RNG */
	ret = rand_init();
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize log */
	ret = log_init(&priv->log);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize config */
	ret = conf_init(&ph->conf);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize communications */
	priv->conn_listen.type = CONN_TYPE_TCP;
	ret = conn_init(&priv->conn_listen);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize registration service */
	ret = registration_service_init(&priv->reg_service);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize the usable_clients mutex */
	ret = mutex_init(&priv->usable_clients_mutex);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize the idle_clients mutex */
	ret = mutex_init(&priv->idle_clients_mutex);
	if (ret < 0)
		goto proxy_init_exit;

	/* Initialize the idle_workers mutex */
	ret = mutex_init(&priv->idle_workers_mutex);
	if (ret < 0)
		goto proxy_init_exit;

	return 0;

proxy_init_exit:
	proxy_free(ph);

	return ret;
}